

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O3

void constructor_destroy(constructor ctor)

{
  ulong uVar1;
  set *ppsVar2;
  ulong uVar3;
  
  if (ctor != (constructor)0x0) {
    uVar1 = ctor->count;
    if (uVar1 != 0) {
      ppsVar2 = &ctor[1].map;
      uVar3 = 0;
      do {
        if (*ppsVar2 != (set)0x0) {
          free(*ppsVar2);
          uVar1 = ctor->count;
        }
        uVar3 = uVar3 + 1;
        ppsVar2 = ppsVar2 + 3;
      } while (uVar3 < uVar1);
    }
    set_destroy(ctor->map);
    free(ctor);
    return;
  }
  return;
}

Assistant:

void constructor_destroy(constructor ctor)
{
	if (ctor != NULL)
	{
		size_t index;

		for (index = 0; index < ctor->count; ++index)
		{
			constructor_node node = constructor_at(ctor, index);

			if (node != NULL && node->name != NULL)
			{
				free(node->name);
			}
		}

		set_destroy(ctor->map);

		free(ctor);
	}
}